

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_locate(REF_INTERP ref_interp)

{
  size_t __size;
  REF_INT RVar1;
  REF_MPI ref_mpi;
  REF_GRID pRVar2;
  REF_GRID ref_grid;
  REF_NODE pRVar3;
  REF_NODE pRVar4;
  REF_DBL *pRVar5;
  REF_INTERP ref_interp_00;
  uint *puVar6;
  void *my_array;
  bool bVar7;
  uint uVar8;
  REF_MPI ref_mpi_00;
  void *my_array_00;
  ulong uVar9;
  REF_INT *pRVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  REF_DBL *pRVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  int iVar20;
  REF_INT RVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  REF_INT total_node;
  REF_NODE local_e0;
  REF_INT *local_d8;
  REF_BOOL increase_fuzz;
  undefined4 uStack_cc;
  REF_INT nrecv;
  REF_INT *local_c0;
  void *local_b8;
  REF_DBL *local_b0;
  REF_MPI local_a8;
  REF_INT *source;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  REF_DBL *global_xyz;
  REF_LIST from_geom_list;
  REF_GRID local_60;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  ref_mpi_00 = ref_mpi;
  if (ref_interp->instrument != 0) {
    uVar8 = ref_mpi_stopwatch_start(ref_mpi);
    if (uVar8 != 0) {
      pcVar18 = "locate clock";
      uVar11 = 0x6ba;
      goto LAB_0015bfc7;
    }
    ref_mpi_00 = ref_interp->ref_mpi;
  }
  pRVar2 = ref_interp->from_grid;
  ref_grid = ref_interp->to_grid;
  pRVar3 = ref_grid->node;
  pRVar4 = pRVar2->node;
  local_a8 = ref_mpi;
  uVar8 = ref_list_create((REF_LIST *)&increase_fuzz);
  if (uVar8 == 0) {
    local_e0 = pRVar4;
    local_60 = pRVar2;
    uVar8 = ref_list_create(&from_geom_list);
    if (uVar8 != 0) {
      pcVar18 = "create list";
      uVar11 = 0x3ee;
      goto LAB_0015bf9c;
    }
    uVar8 = ref_interp_geom_node_list(ref_grid,(REF_LIST)CONCAT44(uStack_cc,increase_fuzz));
    if (uVar8 != 0) {
      pcVar18 = "to list";
      uVar11 = 0x3ef;
      goto LAB_0015bf9c;
    }
    uVar8 = ref_interp_geom_node_list(local_60,from_geom_list);
    if (uVar8 != 0) {
      pcVar18 = "from list";
      uVar11 = 0x3f0;
      goto LAB_0015bf9c;
    }
    puVar6 = (uint *)CONCAT44(uStack_cc,increase_fuzz);
    uVar19 = (ulong)*puVar6;
    if ((int)*puVar6 < 0) {
      pcVar18 = "malloc local_node of REF_INT negative";
      uVar11 = 0x3f2;
LAB_0015c0ac:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar11,"ref_interp_geom_nodes",pcVar18);
LAB_0015c0b3:
      uVar8 = 1;
    }
    else {
      local_80 = malloc(uVar19 * 4);
      if (local_80 == (void *)0x0) {
        pcVar18 = "malloc local_node of REF_INT NULL";
        uVar11 = 0x3f2;
      }
      else {
        my_array_00 = malloc(uVar19 * 0x18);
        my_array = local_80;
        if (my_array_00 != (void *)0x0) {
          if (uVar19 == 0) {
            uVar8 = 0;
          }
          else {
            lVar15 = *(long *)(puVar6 + 2);
            pRVar5 = pRVar3->real;
            pRVar16 = (REF_DBL *)((long)my_array_00 + 0x10);
            lVar17 = 0;
            do {
              iVar20 = *(int *)(lVar15 + lVar17 * 4);
              lVar12 = (long)iVar20;
              *(int *)((long)local_80 + lVar17 * 4) = iVar20;
              pRVar16[-2] = pRVar5[lVar12 * 0xf];
              pRVar16[-1] = pRVar5[lVar12 * 0xf + 1];
              *pRVar16 = pRVar5[lVar12 * 0xf + 2];
              lVar17 = lVar17 + 1;
              uVar8 = *puVar6;
              pRVar16 = pRVar16 + 3;
            } while (lVar17 < (int)uVar8);
          }
          uVar8 = ref_mpi_allconcat(ref_mpi_00,3,uVar8,my_array_00,&total_node,&source,&global_xyz,3
                                   );
          if (uVar8 == 0) {
            local_38 = my_array_00;
            if (source != (REF_INT *)0x0) {
              free(source);
            }
            uVar8 = ref_mpi_allconcat(ref_mpi_00,1,*(REF_INT *)CONCAT44(uStack_cc,increase_fuzz),
                                      my_array,&total_node,&source,&global_node,1);
            RVar21 = total_node;
            if (uVar8 == 0) {
              lVar15 = (long)total_node;
              if (lVar15 < 0) {
                pcVar18 = "malloc best_dist of REF_DBL negative";
                uVar11 = 0x405;
                goto LAB_0015c0ac;
              }
              local_b0 = (REF_DBL *)malloc(lVar15 * 8);
              if (local_b0 == (REF_DBL *)0x0) {
                pcVar18 = "malloc best_dist of REF_DBL NULL";
                uVar11 = 0x405;
              }
              else {
                local_b8 = malloc(lVar15 * 4);
                if (local_b8 == (void *)0x0) {
                  pcVar18 = "malloc best_node of REF_INT NULL";
                  uVar11 = 0x406;
                }
                else {
                  local_c0 = (REF_INT *)malloc(lVar15 * 4);
                  if (local_c0 == (REF_INT *)0x0) {
                    pcVar18 = "malloc from_proc of REF_INT NULL";
                    uVar11 = 0x407;
                  }
                  else {
                    if (RVar21 != 0) {
                      uVar8 = from_geom_list->n;
                      lVar17 = 0;
                      do {
                        local_b0[lVar17] = 1e+20;
                        *(undefined4 *)((long)local_b8 + lVar17 * 4) = 0xffffffff;
                        if (0 < (int)uVar8) {
                          pRVar10 = from_geom_list->value;
                          pRVar5 = local_e0->real;
                          auVar23 = ZEXT816(0x4415af1d78b58c40);
                          uVar19 = 0;
                          do {
                            iVar20 = pRVar10[uVar19];
                            lVar12 = (long)iVar20;
                            dVar25 = SQRT((global_xyz[lVar17 * 3 + 2] - pRVar5[lVar12 * 0xf + 2]) *
                                          (global_xyz[lVar17 * 3 + 2] - pRVar5[lVar12 * 0xf + 2]) +
                                          (global_xyz[lVar17 * 3 + 1] - pRVar5[lVar12 * 0xf + 1]) *
                                          (global_xyz[lVar17 * 3 + 1] - pRVar5[lVar12 * 0xf + 1]) +
                                          (global_xyz[lVar17 * 3] - pRVar5[lVar12 * 0xf]) *
                                          (global_xyz[lVar17 * 3] - pRVar5[lVar12 * 0xf]));
                            if ((uVar19 == 0) || (dVar25 < auVar23._0_8_)) {
                              local_b0[lVar17] = dVar25;
                              *(int *)((long)local_b8 + lVar17 * 4) = iVar20;
                              auVar23._8_8_ = 0;
                              auVar23._0_8_ = dVar25;
                            }
                            uVar19 = uVar19 + 1;
                          } while (uVar8 != uVar19);
                        }
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != lVar15);
                    }
                    uVar8 = ref_mpi_allminwho(ref_mpi_00,local_b0,local_c0,RVar21);
                    RVar21 = total_node;
                    if (uVar8 != 0) {
                      pcVar18 = "who";
                      uVar11 = 0x419;
                      goto LAB_0015bf9c;
                    }
                    uVar19 = (ulong)total_node;
                    if ((long)uVar19 < 1) {
                      uVar8 = 0;
                    }
                    else {
                      uVar9 = 0;
                      uVar8 = 0;
                      do {
                        uVar8 = uVar8 + (ref_mpi_00->id == local_c0[uVar9]);
                        uVar9 = uVar9 + 1;
                      } while (uVar19 != uVar9);
                    }
                    local_88 = malloc((ulong)(uVar8 * 4) << 3);
                    if (local_88 == (void *)0x0) {
                      pcVar18 = "malloc send_bary of REF_DBL NULL";
                      uVar11 = 0x41f;
                    }
                    else {
                      uVar9 = (ulong)uVar8;
                      __size = uVar9 * 4;
                      local_90 = malloc(__size);
                      if (local_90 == (void *)0x0) {
                        pcVar18 = "malloc send_cell of REF_INT NULL";
                        uVar11 = 0x420;
                      }
                      else {
                        local_98 = malloc(__size);
                        if (local_98 == (void *)0x0) {
                          pcVar18 = "malloc send_node of REF_INT NULL";
                          uVar11 = 0x421;
                        }
                        else {
                          local_d8 = (REF_INT *)malloc(__size);
                          if (local_d8 == (REF_INT *)0x0) {
                            pcVar18 = "malloc send_proc of REF_INT NULL";
                            uVar11 = 0x422;
                          }
                          else {
                            local_e0 = (REF_NODE)malloc(__size);
                            auVar23 = _DAT_002111c0;
                            if (local_e0 != (REF_NODE)0x0) {
                              if (uVar8 != 0) {
                                RVar1 = ref_mpi_00->id;
                                lVar15 = uVar9 - 1;
                                auVar22._8_4_ = (int)lVar15;
                                auVar22._0_8_ = lVar15;
                                auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
                                uVar13 = 0;
                                auVar22 = auVar22 ^ _DAT_002111c0;
                                auVar24 = _DAT_002111a0;
                                auVar26 = _DAT_002111b0;
                                do {
                                  auVar27 = auVar26 ^ auVar23;
                                  iVar20 = auVar22._4_4_;
                                  if ((bool)(~(auVar27._4_4_ == iVar20 &&
                                               auVar22._0_4_ < auVar27._0_4_ ||
                                              iVar20 < auVar27._4_4_) & 1)) {
                                    *(REF_INT *)((long)&local_e0->n + uVar13) = RVar1;
                                  }
                                  if ((auVar27._12_4_ != auVar22._12_4_ ||
                                      auVar27._8_4_ <= auVar22._8_4_) &&
                                      auVar27._12_4_ <= auVar22._12_4_) {
                                    *(REF_INT *)((long)&local_e0->max + uVar13) = RVar1;
                                  }
                                  auVar27 = auVar24 ^ auVar23;
                                  iVar28 = auVar27._4_4_;
                                  if (iVar28 <= iVar20 &&
                                      (iVar28 != iVar20 || auVar27._0_4_ <= auVar22._0_4_)) {
                                    *(REF_INT *)((long)&local_e0->blank + uVar13) = RVar1;
                                    *(REF_INT *)(&local_e0->field_0xc + uVar13) = RVar1;
                                  }
                                  lVar15 = auVar26._8_8_;
                                  auVar26._0_8_ = auVar26._0_8_ + 4;
                                  auVar26._8_8_ = lVar15 + 4;
                                  lVar15 = auVar24._8_8_;
                                  auVar24._0_8_ = auVar24._0_8_ + 4;
                                  auVar24._8_8_ = lVar15 + 4;
                                  uVar13 = uVar13 + 0x10;
                                } while ((uVar9 * 4 + 0xc & 0xfffffffffffffff0) != uVar13);
                              }
                              if (RVar21 < 1) {
                                RVar21 = 0;
                              }
                              else {
                                lVar17 = 0;
                                lVar15 = 0;
                                RVar21 = 0;
                                do {
                                  if (ref_mpi_00->id == local_c0[lVar15]) {
                                    uVar8 = *(uint *)((long)local_b8 + lVar15 * 4);
                                    if (uVar8 == 0xffffffff) {
                                      pcVar18 = "no geom node";
                                      uVar11 = 0x428;
                                      goto LAB_0015c0ac;
                                    }
                                    lVar12 = (long)RVar21;
                                    *(REF_INT *)((long)local_98 + lVar12 * 4) = global_node[lVar15];
                                    local_d8[lVar12] = source[lVar15];
                                    pRVar5 = (REF_DBL *)((long)local_90 + lVar12 * 4);
                                    ref_interp_00 = (REF_INTERP)ref_interp->from_grid->node;
                                    if (local_60->twod == 0) {
                                      uVar8 = ref_interp_exhaustive_tet_around_node
                                                        (ref_interp_00,(REF_INT)ref_interp->from_tet
                                                         ,(REF_DBL *)(ulong)uVar8,
                                                         (REF_INT *)((long)global_xyz + lVar17),
                                                         pRVar5);
                                      if (uVar8 != 0) {
                                        pcVar18 = "tet around node";
                                        uVar11 = 0x435;
                                        goto LAB_0015bf9c;
                                      }
                                    }
                                    else {
                                      uVar8 = ref_interp_exhaustive_tri_around_node
                                                        (ref_interp_00,(REF_INT)ref_interp->from_tri
                                                         ,(REF_DBL *)(ulong)uVar8,
                                                         (REF_INT *)((long)global_xyz + lVar17),
                                                         pRVar5);
                                      if (uVar8 != 0) {
                                        pcVar18 = "tri around node";
                                        uVar11 = 0x430;
                                        goto LAB_0015bf9c;
                                      }
                                    }
                                    RVar21 = RVar21 + 1;
                                    uVar19 = (ulong)(uint)total_node;
                                  }
                                  lVar15 = lVar15 + 1;
                                  lVar17 = lVar17 + 0x18;
                                } while (lVar15 < (int)uVar19);
                              }
                              uVar8 = ref_mpi_blindsend(ref_mpi_00,local_d8,local_98,1,RVar21,
                                                        &recv_node,&nrecv,1);
                              if (uVar8 == 0) {
                                uVar8 = ref_mpi_blindsend(ref_mpi_00,local_d8,local_90,1,RVar21,
                                                          &recv_cell,&nrecv,1);
                                if (uVar8 == 0) {
                                  uVar8 = ref_mpi_blindsend(ref_mpi_00,local_d8,local_e0,1,RVar21,
                                                            &recv_proc,&nrecv,1);
                                  if (uVar8 == 0) {
                                    uVar8 = ref_mpi_blindsend(ref_mpi_00,local_d8,local_88,4,RVar21,
                                                              &local_78,&nrecv,3);
                                    if (uVar8 == 0) {
                                      if (0 < nrecv) {
                                        lVar17 = 0;
                                        lVar15 = 0;
                                        RVar21 = nrecv;
                                        do {
                                          dVar25 = ref_interp->inside;
                                          if ((((*(double *)((long)local_78 + lVar15 * 0x20) <=
                                                 dVar25) ||
                                               (*(double *)((long)local_78 + lVar15 * 0x20 + 8) <=
                                                dVar25)) ||
                                              (*(double *)((long)local_78 + lVar15 * 0x20 + 0x10) <=
                                               dVar25)) ||
                                             (*(double *)((long)local_78 + lVar15 * 0x20 + 0x18) <=
                                              dVar25)) {
                                            ref_interp->n_geom_fail = ref_interp->n_geom_fail + 1;
                                          }
                                          else {
                                            ref_interp->n_geom = ref_interp->n_geom + 1;
                                            iVar20 = recv_node[lVar15];
                                            lVar12 = (long)iVar20;
                                            pRVar10 = ref_interp->cell;
                                            if ((long)pRVar10[lVar12] != -1) {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x44e,"ref_interp_geom_nodes",
                                                  "geom already found?",0xffffffffffffffff,
                                                  (long)pRVar10[lVar12]);
                                              goto LAB_0015c0b3;
                                            }
                                            if (ref_interp->agent_hired[lVar12] != 0) {
                                              uVar8 = ref_agents_delete(ref_interp->ref_agents,
                                                                        iVar20);
                                              if (uVar8 != 0) {
                                                pcVar18 = "deq";
                                                uVar11 = 0x450;
                                                goto LAB_0015bf9c;
                                              }
                                              ref_interp->agent_hired[lVar12] = 0;
                                              pRVar10 = ref_interp->cell;
                                            }
                                            pRVar10[lVar12] = recv_cell[lVar15];
                                            ref_interp->part[lVar12] = recv_proc[lVar15];
                                            pRVar5 = ref_interp->bary;
                                            lVar14 = 0;
                                            do {
                                              pRVar5[lVar12 * 4 + lVar14] =
                                                   *(REF_DBL *)
                                                    ((long)local_78 + lVar14 * 8 + lVar17);
                                              lVar14 = lVar14 + 1;
                                            } while (lVar14 != 4);
                                            uVar8 = ref_interp_push_onto_queue(ref_interp,iVar20);
                                            RVar21 = nrecv;
                                            if (uVar8 != 0) {
                                              pcVar18 = "push";
                                              uVar11 = 0x457;
                                              goto LAB_0015bf9c;
                                            }
                                          }
                                          lVar15 = lVar15 + 1;
                                          lVar17 = lVar17 + 0x20;
                                        } while (lVar15 < RVar21);
                                      }
                                      uVar8 = ref_mpi_allsum(ref_mpi_00,&ref_interp->n_geom,1,1);
                                      if (uVar8 == 0) {
                                        uVar8 = ref_mpi_allsum(ref_mpi_00,&ref_interp->n_geom_fail,1
                                                               ,1);
                                        if (uVar8 == 0) {
                                          if (recv_node != (REF_INT *)0x0) {
                                            free(recv_node);
                                          }
                                          if (recv_cell != (REF_INT *)0x0) {
                                            free(recv_cell);
                                          }
                                          if (recv_proc != (REF_INT *)0x0) {
                                            free(recv_proc);
                                          }
                                          if (local_78 != (void *)0x0) {
                                            free(local_78);
                                          }
                                          free(local_88);
                                          free(local_e0);
                                          free(local_90);
                                          free(local_98);
                                          free(local_d8);
                                          free(local_c0);
                                          free(local_b8);
                                          free(local_b0);
                                          if (source != (REF_INT *)0x0) {
                                            free(source);
                                          }
                                          if (global_node != (REF_INT *)0x0) {
                                            free(global_node);
                                          }
                                          if (global_xyz != (REF_DBL *)0x0) {
                                            free(global_xyz);
                                          }
                                          free(local_38);
                                          free(local_80);
                                          ref_list_free(from_geom_list);
                                          ref_list_free((REF_LIST)CONCAT44(uStack_cc,increase_fuzz))
                                          ;
                                          if ((ref_interp->instrument == 0) ||
                                             (uVar8 = ref_mpi_stopwatch_stop(local_a8,"geom"),
                                             uVar8 == 0)) {
                                            uVar8 = ref_interp_process_agents(ref_interp);
                                            if (uVar8 == 0) {
                                              if ((ref_interp->instrument == 0) ||
                                                 (uVar8 = ref_mpi_stopwatch_stop(local_a8,"drain"),
                                                 uVar8 == 0)) {
                                                increase_fuzz = 0;
                                                bVar7 = true;
                                                iVar20 = 0xc;
                                                while( true ) {
                                                  if ((!bVar7) &&
                                                     (ref_interp->search_fuzz =
                                                           ref_interp->search_fuzz * 10.0,
                                                     local_a8->id == 0)) {
                                                    printf("retry tree search with %e fuzz\n");
                                                  }
                                                  uVar8 = ref_interp_tree(ref_interp,&increase_fuzz)
                                                  ;
                                                  if (uVar8 != 0) break;
                                                  if ((ref_interp->instrument != 0) &&
                                                     (uVar8 = ref_mpi_stopwatch_stop
                                                                        (local_a8,"tree"),
                                                     uVar8 != 0)) {
                                                    pcVar18 = "locate clock";
                                                    uVar11 = 0x6ce;
                                                    goto LAB_0015bfc7;
                                                  }
                                                  if ((long)increase_fuzz == 0) {
                                                    return 0;
                                                  }
                                                  bVar7 = false;
                                                  iVar20 = iVar20 + -1;
                                                  if (iVar20 == 0) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                                  ,0x6d1,"ref_interp_locate",
                                                  "unable to grow fuzz to find tree candidate",0,
                                                  (long)increase_fuzz);
                                                  return 1;
                                                  }
                                                }
                                                pcVar18 = "tree";
                                                uVar11 = 0x6cc;
                                              }
                                              else {
                                                pcVar18 = "locate clock";
                                                uVar11 = 0x6c2;
                                              }
                                            }
                                            else {
                                              pcVar18 = "drain";
                                              uVar11 = 0x6c0;
                                            }
                                          }
                                          else {
                                            pcVar18 = "locate clock";
                                            uVar11 = 0x6be;
                                          }
                                          goto LAB_0015bfc7;
                                        }
                                        pcVar18 = "as";
                                        uVar11 = 0x45f;
                                      }
                                      else {
                                        pcVar18 = "as";
                                        uVar11 = 0x45d;
                                      }
                                    }
                                    else {
                                      pcVar18 = "blind send bary";
                                      uVar11 = 0x445;
                                    }
                                  }
                                  else {
                                    pcVar18 = "blind send proc";
                                    uVar11 = 0x442;
                                  }
                                }
                                else {
                                  pcVar18 = "blind send cell";
                                  uVar11 = 0x43f;
                                }
                              }
                              else {
                                pcVar18 = "blind send node";
                                uVar11 = 0x43c;
                              }
                              goto LAB_0015bf9c;
                            }
                            pcVar18 = "malloc my_proc of REF_INT NULL";
                            uVar11 = 0x423;
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0015c101;
            }
            pcVar18 = "cat";
            uVar11 = 0x403;
          }
          else {
            pcVar18 = "cat";
            uVar11 = 0x3fe;
          }
          goto LAB_0015bf9c;
        }
        pcVar18 = "malloc local_xyz of REF_DBL NULL";
        uVar11 = 0x3f3;
      }
LAB_0015c101:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar11,"ref_interp_geom_nodes",pcVar18);
      uVar8 = 2;
    }
  }
  else {
    pcVar18 = "create list";
    uVar11 = 0x3ed;
LAB_0015bf9c:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11
           ,"ref_interp_geom_nodes",(ulong)uVar8,pcVar18);
  }
  pcVar18 = "geom nodes";
  uVar11 = 0x6bc;
LAB_0015bfc7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11,
         "ref_interp_locate",(ulong)uVar8,pcVar18);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_geom_nodes(ref_interp), "geom nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "geom"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}